

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall
QAbstractSpinBoxPrivate::updateState(QAbstractSpinBoxPrivate *this,bool up,bool fromKeyboard)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  code *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long *local_58;
  undefined8 uStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
  if ((int)CONCAT71(in_register_00000031,up) == 0) {
LAB_004824c8:
    if ((this->buttonState & 0x20) != 0) goto LAB_004825d6;
  }
  else {
    if ((this->buttonState & 0x10) != 0) goto LAB_004825d6;
    if (!up) goto LAB_004824c8;
  }
  reset(this);
  if (plVar1 != (long *)0x0) {
    uVar2 = (**(code **)(*plVar1 + 0x1c8))(plVar1);
    if ((uVar2 & 2 - up) != 0) {
      this->buttonState = ((uint)!up * 0x10 - (uint)fromKeyboard) + 0x12;
      uVar3 = up - 1 | 1;
      uVar2 = uVar3 * 10;
      if ((this->stepModifier &
          (this->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
          super_QFlagsStorage<Qt::KeyboardModifier>.i) == NoModifier) {
        uVar2 = uVar3;
      }
      (**(code **)(*plVar1 + 0x1b0))(plVar1,uVar2);
      QBasicTimer::start(&this->spinClickThresholdTimer,
                         (long)this->spinClickThresholdTimerInterval * 1000000,1,plVar1);
      local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uStack_60 = 0x80c1;
      uStack_5c = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaaffffffff;
      local_68 = QTextDocument::setMarkdown;
      local_58 = plVar1;
      ::QVariant::QVariant((QVariant *)&local_48,&this->value);
      _uStack_60 = CONCAT44(uStack_5c,0x800e);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_68);
    }
  }
LAB_004825d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateState(bool up, bool fromKeyboard /* = false */)
{
    Q_Q(QAbstractSpinBox);
    if ((up && (buttonState & Up)) || (!up && (buttonState & Down)))
        return;
    reset();
    if (q && (q->stepEnabled() & (up ? QAbstractSpinBox::StepUpEnabled
                                  : QAbstractSpinBox::StepDownEnabled))) {
        buttonState = (up ? Up : Down) | (fromKeyboard ? Keyboard : Mouse);
        int steps = up ? 1 : -1;
        if (keyboardModifiers & stepModifier)
            steps *= 10;
        q->stepBy(steps);
        spinClickThresholdTimer.start(spinClickThresholdTimerInterval * 1ms, q);
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, value);
        QAccessible::updateAccessibility(&event);
#endif
    }
}